

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeGlobalSet
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Name global)

{
  Global *pGVar1;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_60;
  Index local_34;
  
  local_34 = pos;
  pGVar1 = Module::getGlobalOrNull(this->wasm,global);
  if (pGVar1 != (Global *)0x0) {
    IRBuilder::makeGlobalSet((Result<wasm::Ok> *)&local_60,&this->irBuilder,global);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,local_34,(Result<wasm::Ok> *)&local_60);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (&local_60);
    return __return_storage_ptr__;
  }
  __assert_fail("wasm.getGlobalOrNull(global)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                ,0x80a,
                "Result<> wasm::WATParser::ParseDefsCtx::makeGlobalSet(Index, const std::vector<Annotation> &, Name)"
               );
}

Assistant:

Result<> makeGlobalSet(Index pos,
                         const std::vector<Annotation>& annotations,
                         Name global) {
    assert(wasm.getGlobalOrNull(global));
    return withLoc(pos, irBuilder.makeGlobalSet(global));
  }